

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mcts.cpp
# Opt level: O2

void __thiscall TestGame::do_move(TestGame *this,Move move)

{
  int iVar1;
  int iVar2;
  char *expr;
  
  iVar1 = this->player_to_move;
  if (iVar1 == 2) {
    if (4 < move - 1U) {
      expr = "move >= 1 && move <= 5";
      iVar1 = 0x2e;
LAB_0014ed85:
      MCTS::assertion_failed
                (expr,
                 "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/tests/test_mcts.cpp"
                 ,iVar1);
    }
    if (move == 1) {
      iVar2 = 1;
    }
    else {
      iVar2 = this->X;
    }
  }
  else {
    if (iVar1 != 1) goto LAB_0014ed5a;
    if (1 < move - 1U) {
      expr = "move >= 1 && move <= 2";
      iVar1 = 0x25;
      goto LAB_0014ed85;
    }
    iVar2 = 0;
    if (move != 1) goto LAB_0014ed5a;
  }
  this->winner = iVar2;
LAB_0014ed5a:
  this->player_to_move = 3 - iVar1;
  return;
}

Assistant:

void do_move(Move move)
	{
		if (player_to_move == 1) {
			attest(move >= 1 && move <= 2);

			if (move == 1) {
				winner = 0;
			}
			else {
			}
		}
		else if (player_to_move == 2) {
			attest(move >= 1 && move <= 5);

			if (move == 1) {
				winner = 1;
			}
			else {
				winner = X;
			}
		}

		player_to_move = 3 - player_to_move;
	}